

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall Js::PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity(PathTypeHandlerBase *this)

{
  bool bVar1;
  uint16 uVar2;
  PathTypeHandlerBase *pPVar3;
  ushort local_32;
  PathTypeHandlerBase *rootTypeHandler;
  uint16 newInlineSlotCapacity;
  uint16 maxPathLength;
  PathTypeHandlerBase *pPStack_18;
  bool shrunk;
  PathTypeHandlerBase *rootTypeHandler_1;
  PathTypeHandlerBase *this_local;
  
  rootTypeHandler_1 = this;
  bVar1 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (!bVar1) {
    pPStack_18 = GetRootPathTypeHandler(this);
    rootTypeHandler._7_1_ = 0;
    rootTypeHandler._4_2_ = 0;
    bVar1 = GetMaxPathLength(pPStack_18,(uint16 *)((long)&rootTypeHandler + 4));
    if (bVar1) {
      bVar1 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
      if (bVar1) {
        local_32 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                             (rootTypeHandler._4_2_);
      }
      else {
        local_32 = DynamicTypeHandler::RoundUpInlineSlotCapacity(rootTypeHandler._4_2_);
      }
      rootTypeHandler._2_2_ = local_32;
      uVar2 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
      if (local_32 < uVar2) {
        ShrinkSlotAndInlineSlotCapacity(pPStack_18,rootTypeHandler._2_2_);
        rootTypeHandler._7_1_ = 1;
      }
    }
    if ((rootTypeHandler._7_1_ & 1) == 0) {
      (*(pPStack_18->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3e])();
    }
  }
  pPVar3 = GetRootPathTypeHandler(this);
  (*(pPVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x40])();
  return;
}

Assistant:

void PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity()
    {
        if (!GetIsInlineSlotCapacityLocked())
        {
            PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();

            bool shrunk = false;
            uint16 maxPathLength = 0;
            if (rootTypeHandler->GetMaxPathLength(&maxPathLength))
            {
                uint16 newInlineSlotCapacity =
                    IsObjectHeaderInlinedTypeHandler()
                        ? RoundUpObjectHeaderInlinedInlineSlotCapacity(maxPathLength)
                        : RoundUpInlineSlotCapacity(maxPathLength);
                if (newInlineSlotCapacity < GetInlineSlotCapacity())
                {
                    rootTypeHandler->ShrinkSlotAndInlineSlotCapacity(newInlineSlotCapacity);
                    shrunk = true;
                }
            }

            if (!shrunk)
            {
                rootTypeHandler->LockInlineSlotCapacity();
            }
        }

#if DBG
        PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();
        rootTypeHandler->VerifyInlineSlotCapacityIsLocked();
#endif
    }